

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_sm4_hw.c
# Opt level: O0

int cipher_hw_sm4_initkey(PROV_CIPHER_CTX *ctx,uchar *key,size_t keylen)

{
  undefined8 *in_RDI;
  SM4_KEY *ks;
  PROV_SM4_CTX *sctx;
  
  ossl_sm4_set_key((uint8_t *)keylen,(SM4_KEY *)sctx);
  in_RDI[0x16] = in_RDI + 0x18;
  if (((*(byte *)((long)in_RDI + 0x3c) >> 1 & 1) == 0) &&
     ((*(int *)(in_RDI + 2) == 1 || (*(int *)(in_RDI + 2) == 2)))) {
    *in_RDI = ossl_sm4_decrypt;
  }
  else {
    *in_RDI = ossl_sm4_encrypt;
  }
  return 1;
}

Assistant:

static int cipher_hw_sm4_initkey(PROV_CIPHER_CTX *ctx,
                                 const unsigned char *key, size_t keylen)
{
    PROV_SM4_CTX *sctx =  (PROV_SM4_CTX *)ctx;
    SM4_KEY *ks = &sctx->ks.ks;

    ossl_sm4_set_key(key, ks);
    ctx->ks = ks;
    if (ctx->enc
            || (ctx->mode != EVP_CIPH_ECB_MODE
                && ctx->mode != EVP_CIPH_CBC_MODE))
        ctx->block = (block128_f)ossl_sm4_encrypt;
    else
        ctx->block = (block128_f)ossl_sm4_decrypt;
    return 1;
}